

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FluxReg_3D_C.H
# Opt level: O0

void amrex::fluxreg_fineareaadd
               (Box *bx,Array4<double> *reg,int rcomp,Array4<const_double> *area,
               Array4<const_double> *flx,int fcomp,int ncomp,int dir,Dim3 *ratio,Real mult)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long *in_RCX;
  long lVar9;
  int in_EDX;
  long *in_RSI;
  int *in_RDI;
  long *in_R8;
  int in_R9D;
  double in_XMM0_Qa;
  Dim3 hi;
  int in_stack_00000010;
  int *in_stack_00000018;
  Dim3 lo;
  int local_268;
  int local_264;
  int local_25c;
  int local_258;
  int local_254;
  int local_244;
  int local_240;
  int local_238;
  int local_234;
  int local_230;
  int local_220;
  int local_21c;
  int local_214;
  int local_210;
  int local_20c;
  int i_2;
  int ioff_1;
  int ic_2;
  int j_2;
  int joff_1;
  int jc_2;
  int n_2;
  int k_2;
  int kc_2;
  int i_1;
  int ioff;
  int ic_1;
  int k_1;
  int koff_1;
  int kc_1;
  int n_1;
  int j_1;
  int jc_1;
  int j;
  int joff;
  int jc;
  int k;
  int koff;
  int kc;
  int n;
  int i;
  int ic;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  iVar3 = in_RDI[2];
  iVar4 = in_RDI[3];
  iVar5 = in_RDI[4];
  iVar6 = in_RDI[5];
  if (in_stack_00000010 == 0) {
    iVar4 = *in_stack_00000018;
    for (local_20c = 0; local_210 = iVar3, local_20c < hi.z; local_20c = local_20c + 1) {
      for (; local_210 <= iVar6; local_210 = local_210 + 1) {
        for (local_214 = 0; local_214 < in_stack_00000018[2]; local_214 = local_214 + 1) {
          iVar7 = in_stack_00000018[2] * local_210 + local_214;
          for (local_21c = iVar2; local_21c <= iVar5; local_21c = local_21c + 1) {
            for (local_220 = 0; local_220 < in_stack_00000018[1]; local_220 = local_220 + 1) {
              iVar8 = in_stack_00000018[1] * local_21c + local_220;
              lVar9 = (long)(iVar1 - (int)in_RSI[4]) +
                      (long)(local_21c - *(int *)((long)in_RSI + 0x24)) * in_RSI[1] +
                      (long)(local_210 - (int)in_RSI[5]) * in_RSI[2] +
                      (long)(local_20c + in_EDX) * in_RSI[3];
              *(double *)(*in_RSI + lVar9 * 8) =
                   in_XMM0_Qa *
                   *(double *)
                    (*in_RCX +
                    ((long)(iVar1 * iVar4 - (int)in_RCX[4]) +
                     (long)(iVar8 - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
                    (long)(iVar7 - (int)in_RCX[5]) * in_RCX[2]) * 8) *
                   *(double *)
                    (*in_R8 + ((long)(iVar1 * iVar4 - (int)in_R8[4]) +
                               (long)(iVar8 - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                               (long)(iVar7 - (int)in_R8[5]) * in_R8[2] +
                              (long)(local_20c + in_R9D) * in_R8[3]) * 8) +
                   *(double *)(*in_RSI + lVar9 * 8);
            }
          }
        }
      }
    }
  }
  else if (in_stack_00000010 == 1) {
    iVar5 = in_stack_00000018[1];
    for (local_230 = 0; local_234 = iVar3, local_230 < hi.z; local_230 = local_230 + 1) {
      for (; local_234 <= iVar6; local_234 = local_234 + 1) {
        for (local_238 = 0; local_238 < in_stack_00000018[2]; local_238 = local_238 + 1) {
          iVar7 = in_stack_00000018[2] * local_234 + local_238;
          for (local_240 = iVar1; local_240 <= iVar4; local_240 = local_240 + 1) {
            for (local_244 = 0; local_244 < *in_stack_00000018; local_244 = local_244 + 1) {
              iVar8 = *in_stack_00000018 * local_240 + local_244;
              lVar9 = (long)(local_240 - (int)in_RSI[4]) +
                      (long)(iVar2 - *(int *)((long)in_RSI + 0x24)) * in_RSI[1] +
                      (long)(local_234 - (int)in_RSI[5]) * in_RSI[2] +
                      (long)(local_230 + in_EDX) * in_RSI[3];
              *(double *)(*in_RSI + lVar9 * 8) =
                   in_XMM0_Qa *
                   *(double *)
                    (*in_RCX +
                    ((long)(iVar8 - (int)in_RCX[4]) +
                     (long)(iVar2 * iVar5 - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
                    (long)(iVar7 - (int)in_RCX[5]) * in_RCX[2]) * 8) *
                   *(double *)
                    (*in_R8 + ((long)(iVar8 - (int)in_R8[4]) +
                               (long)(iVar2 * iVar5 - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                               (long)(iVar7 - (int)in_R8[5]) * in_R8[2] +
                              (long)(local_230 + in_R9D) * in_R8[3]) * 8) +
                   *(double *)(*in_RSI + lVar9 * 8);
            }
          }
        }
      }
    }
  }
  else {
    iVar6 = in_stack_00000018[2];
    for (local_254 = 0; local_258 = iVar2, local_254 < hi.z; local_254 = local_254 + 1) {
      for (; local_258 <= iVar5; local_258 = local_258 + 1) {
        for (local_25c = 0; local_25c < in_stack_00000018[1]; local_25c = local_25c + 1) {
          iVar7 = in_stack_00000018[1] * local_258 + local_25c;
          for (local_264 = iVar1; local_264 <= iVar4; local_264 = local_264 + 1) {
            for (local_268 = 0; local_268 < *in_stack_00000018; local_268 = local_268 + 1) {
              iVar8 = *in_stack_00000018 * local_264 + local_268;
              lVar9 = (long)(local_264 - (int)in_RSI[4]) +
                      (long)(local_258 - *(int *)((long)in_RSI + 0x24)) * in_RSI[1] +
                      (long)(iVar3 - (int)in_RSI[5]) * in_RSI[2] +
                      (long)(local_254 + in_EDX) * in_RSI[3];
              *(double *)(*in_RSI + lVar9 * 8) =
                   in_XMM0_Qa *
                   *(double *)
                    (*in_RCX +
                    ((long)(iVar8 - (int)in_RCX[4]) +
                     (long)(iVar7 - *(int *)((long)in_RCX + 0x24)) * in_RCX[1] +
                    (long)(iVar3 * iVar6 - (int)in_RCX[5]) * in_RCX[2]) * 8) *
                   *(double *)
                    (*in_R8 + ((long)(iVar8 - (int)in_R8[4]) +
                               (long)(iVar7 - *(int *)((long)in_R8 + 0x24)) * in_R8[1] +
                               (long)(iVar3 * iVar6 - (int)in_R8[5]) * in_R8[2] +
                              (long)(local_254 + in_R9D) * in_R8[3]) * 8) +
                   *(double *)(*in_RSI + lVar9 * 8);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE inline void
fluxreg_fineareaadd (Box const& bx, Array4<Real> const& reg, const int rcomp,
                     Array4<Real const> const& area,
                     Array4<Real const> const& flx, const int fcomp, const int ncomp,
                     const int dir, Dim3 const& ratio, const Real mult) noexcept
{
    const auto lo  = amrex::lbound(bx);
    const auto hi  = amrex::ubound(bx);

    switch (dir) {
    case 0:
    {
        const int ic = lo.x;
        const int i = ic*ratio.x;
        for (int n = 0; n < ncomp; ++n) {
            for (int kc = lo.z; kc <= hi.z; ++kc) {
                for (int koff = 0; koff < ratio.z; ++koff) {
                    const int k = ratio.z*kc + koff;
                    for (int jc = lo.y; jc <= hi.y; ++jc) {
                        for (int joff = 0; joff < ratio.y; ++joff) {
                            const int j = ratio.y*jc + joff;
                            reg(ic,jc,kc,n+rcomp) += mult*area(i,j,k)
                                                         * flx(i,j,k,n+fcomp);
                        }
                    }
                }
            }
        }
        break;
    }
    case 1:
    {
        const int jc = lo.y;
        const int j = jc*ratio.y;
        for (int n = 0; n < ncomp; ++n) {
            for (int kc = lo.z; kc <= hi.z; ++kc) {
                for (int koff = 0; koff < ratio.z; ++koff) {
                    const int k = ratio.z*kc + koff;
                    for (int ic = lo.x; ic <= hi.x; ++ic) {
                        for (int ioff = 0; ioff < ratio.x; ++ioff) {
                            const int i = ratio.x*ic + ioff;
                            reg(ic,jc,kc,n+rcomp) += mult*area(i,j,k)
                                                         * flx(i,j,k,n+fcomp);
                        }
                    }
                }
            }
        }
        break;
    }
    default:
    {
        const int kc = lo.z;
        const int k = kc*ratio.z;
        for (int n = 0; n < ncomp; ++n) {
            for (int jc = lo.y; jc <= hi.y; ++jc) {
                for (int joff = 0; joff < ratio.y; ++joff) {
                    const int j = ratio.y*jc + joff;
                    for (int ic = lo.x; ic <= hi.x; ++ic) {
                        for (int ioff = 0; ioff < ratio.x; ++ioff) {
                            const int i = ratio.x*ic + ioff;
                            reg(ic,jc,kc,n+rcomp) += mult*area(i,j,k)
                                                         * flx(i,j,k,n+fcomp);
                        }
                    }
                }
            }
        }
    }
    }
}